

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int properties_get_reply_to(PROPERTIES_HANDLE properties,AMQP_VALUE *reply_to_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    iVar3 = 0x3feb;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(properties->composite_value,&item_count);
    iVar3 = 0x3ff3;
    if ((iVar1 == 0) && (iVar3 = 0x3ff9, 4 < item_count)) {
      value = amqpvalue_get_composite_item_in_place(properties->composite_value,4);
      iVar3 = 0x4001;
      if (value != (AMQP_VALUE)0x0) {
        AVar2 = amqpvalue_get_type(value);
        if (AVar2 != AMQP_TYPE_NULL) {
          *reply_to_value = value;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int properties_get_reply_to(PROPERTIES_HANDLE properties, AMQP_VALUE* reply_to_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        if (amqpvalue_get_composite_item_count(properties_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 4)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(properties_instance->composite_value, 4);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    *reply_to_value = item_value;
                    result = 0;
                }
            }
        }
    }

    return result;
}